

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_GetMemUsage_Test::~DBTest_GetMemUsage_Test(DBTest_GetMemUsage_Test *this)

{
  DBTest_GetMemUsage_Test *this_local;
  
  ~DBTest_GetMemUsage_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, GetMemUsage) {
  do {
    ASSERT_LEVELDB_OK(Put("foo", "v1"));
    std::string val;
    ASSERT_TRUE(db_->GetProperty("leveldb.approximate-memory-usage", &val));
    int mem_usage = std::stoi(val);
    ASSERT_GT(mem_usage, 0);
    ASSERT_LT(mem_usage, 5 * 1024 * 1024);
  } while (ChangeOptions());
}